

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O0

DWORD InterpreterThunkEmitter::FillDebugBreak(BYTE *dest,DWORD count)

{
  DWORD count_local;
  BYTE *dest_local;
  
  Memory::CustomHeap::FillDebugBreak(dest,(ulong)count);
  return count;
}

Assistant:

DWORD InterpreterThunkEmitter::FillDebugBreak(_Out_writes_bytes_all_(count) BYTE* dest, _In_ DWORD count)
{
#if defined(_M_ARM)
    Assert(count % 2 == 0);
#elif defined(_M_ARM64)
    Assert(count % 4 == 0);
#endif
    CustomHeap::FillDebugBreak(dest, count);
    return count;
}